

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Chacha20_Vec128.c
# Opt level: O0

void Hacl_Chacha20_Vec128_chacha20_decrypt_128
               (uint32_t len,uint8_t *out,uint8_t *cipher,uint8_t *key,uint8_t *n,uint32_t ctr)

{
  ulong uVar1;
  uint ctr_00;
  ulong *puVar2;
  ulong *puVar3;
  Lib_IntVector_Intrinsics_vec128 y_31;
  Lib_IntVector_Intrinsics_vec128 x_31;
  Lib_IntVector_Intrinsics_vec128 y_30;
  Lib_IntVector_Intrinsics_vec128 x_30;
  Lib_IntVector_Intrinsics_vec128 y_29;
  Lib_IntVector_Intrinsics_vec128 x_29;
  Lib_IntVector_Intrinsics_vec128 y_28;
  Lib_IntVector_Intrinsics_vec128 x_28;
  Lib_IntVector_Intrinsics_vec128 y_27;
  Lib_IntVector_Intrinsics_vec128 x_27;
  Lib_IntVector_Intrinsics_vec128 y_26;
  Lib_IntVector_Intrinsics_vec128 x_26;
  Lib_IntVector_Intrinsics_vec128 y_25;
  Lib_IntVector_Intrinsics_vec128 x_25;
  Lib_IntVector_Intrinsics_vec128 y_24;
  Lib_IntVector_Intrinsics_vec128 x_24;
  Lib_IntVector_Intrinsics_vec128 y_23;
  Lib_IntVector_Intrinsics_vec128 x_23;
  Lib_IntVector_Intrinsics_vec128 y_22;
  Lib_IntVector_Intrinsics_vec128 x_22;
  Lib_IntVector_Intrinsics_vec128 y_21;
  Lib_IntVector_Intrinsics_vec128 x_21;
  Lib_IntVector_Intrinsics_vec128 y_20;
  Lib_IntVector_Intrinsics_vec128 x_20;
  Lib_IntVector_Intrinsics_vec128 y_19;
  Lib_IntVector_Intrinsics_vec128 x_19;
  Lib_IntVector_Intrinsics_vec128 y_18;
  Lib_IntVector_Intrinsics_vec128 x_18;
  Lib_IntVector_Intrinsics_vec128 y_17;
  Lib_IntVector_Intrinsics_vec128 x_17;
  Lib_IntVector_Intrinsics_vec128 y_16;
  Lib_IntVector_Intrinsics_vec128 x_16;
  uint32_t i_1;
  Lib_IntVector_Intrinsics_vec128 v15_1;
  Lib_IntVector_Intrinsics_vec128 v14_1;
  Lib_IntVector_Intrinsics_vec128 v13_1;
  Lib_IntVector_Intrinsics_vec128 v12_1;
  Lib_IntVector_Intrinsics_vec128 v3__6_1;
  Lib_IntVector_Intrinsics_vec128 v1__6_1;
  Lib_IntVector_Intrinsics_vec128 v2__6_1;
  Lib_IntVector_Intrinsics_vec128 v0__6_1;
  Lib_IntVector_Intrinsics_vec128 v3__5_1;
  Lib_IntVector_Intrinsics_vec128 v2__5_1;
  Lib_IntVector_Intrinsics_vec128 v1__5_1;
  Lib_IntVector_Intrinsics_vec128 v0__5_1;
  Lib_IntVector_Intrinsics_vec128 v3_2_1;
  Lib_IntVector_Intrinsics_vec128 v2_2_1;
  Lib_IntVector_Intrinsics_vec128 v1_2_1;
  Lib_IntVector_Intrinsics_vec128 v0_2_1;
  Lib_IntVector_Intrinsics_vec128 v11_1;
  Lib_IntVector_Intrinsics_vec128 v10_1;
  Lib_IntVector_Intrinsics_vec128 v9_1;
  Lib_IntVector_Intrinsics_vec128 v8_1;
  Lib_IntVector_Intrinsics_vec128 v3__4_1;
  Lib_IntVector_Intrinsics_vec128 v1__4_1;
  Lib_IntVector_Intrinsics_vec128 v2__4_1;
  Lib_IntVector_Intrinsics_vec128 v0__4_1;
  Lib_IntVector_Intrinsics_vec128 v3__3_1;
  Lib_IntVector_Intrinsics_vec128 v2__3_1;
  Lib_IntVector_Intrinsics_vec128 v1__3_1;
  Lib_IntVector_Intrinsics_vec128 v0__3_1;
  Lib_IntVector_Intrinsics_vec128 v3_1_1;
  Lib_IntVector_Intrinsics_vec128 v2_1_1;
  Lib_IntVector_Intrinsics_vec128 v1_1_1;
  Lib_IntVector_Intrinsics_vec128 v0_1_1;
  Lib_IntVector_Intrinsics_vec128 v7_1;
  Lib_IntVector_Intrinsics_vec128 v6_1;
  Lib_IntVector_Intrinsics_vec128 v5_1;
  Lib_IntVector_Intrinsics_vec128 v4_1;
  Lib_IntVector_Intrinsics_vec128 v3__2_1;
  Lib_IntVector_Intrinsics_vec128 v1__2_1;
  Lib_IntVector_Intrinsics_vec128 v2__2_1;
  Lib_IntVector_Intrinsics_vec128 v0__2_1;
  Lib_IntVector_Intrinsics_vec128 v3__1_1;
  Lib_IntVector_Intrinsics_vec128 v2__1_1;
  Lib_IntVector_Intrinsics_vec128 v1__1_1;
  Lib_IntVector_Intrinsics_vec128 v0__1_1;
  Lib_IntVector_Intrinsics_vec128 v3_0_1;
  Lib_IntVector_Intrinsics_vec128 v2_0_1;
  Lib_IntVector_Intrinsics_vec128 v1_0_1;
  Lib_IntVector_Intrinsics_vec128 v0_0_1;
  Lib_IntVector_Intrinsics_vec128 v3_3;
  Lib_IntVector_Intrinsics_vec128 v2_3;
  Lib_IntVector_Intrinsics_vec128 v1_3;
  Lib_IntVector_Intrinsics_vec128 v0_3;
  Lib_IntVector_Intrinsics_vec128 v3__0_1;
  Lib_IntVector_Intrinsics_vec128 v1__0_1;
  Lib_IntVector_Intrinsics_vec128 v2__0_1;
  Lib_IntVector_Intrinsics_vec128 v0__0_1;
  Lib_IntVector_Intrinsics_vec128 v3___1;
  Lib_IntVector_Intrinsics_vec128 v2___1;
  Lib_IntVector_Intrinsics_vec128 v1___1;
  Lib_IntVector_Intrinsics_vec128 v0___1;
  Lib_IntVector_Intrinsics_vec128 v3__7;
  Lib_IntVector_Intrinsics_vec128 v2__7;
  Lib_IntVector_Intrinsics_vec128 v1__7;
  Lib_IntVector_Intrinsics_vec128 v0__7;
  Lib_IntVector_Intrinsics_vec128 st15_1;
  Lib_IntVector_Intrinsics_vec128 st14_1;
  Lib_IntVector_Intrinsics_vec128 st13_1;
  Lib_IntVector_Intrinsics_vec128 st12_1;
  Lib_IntVector_Intrinsics_vec128 st11_1;
  Lib_IntVector_Intrinsics_vec128 st10_1;
  Lib_IntVector_Intrinsics_vec128 st9_1;
  Lib_IntVector_Intrinsics_vec128 st8_1;
  Lib_IntVector_Intrinsics_vec128 st7_1;
  Lib_IntVector_Intrinsics_vec128 st6_1;
  Lib_IntVector_Intrinsics_vec128 st5_1;
  Lib_IntVector_Intrinsics_vec128 st4_1;
  Lib_IntVector_Intrinsics_vec128 st3_1;
  Lib_IntVector_Intrinsics_vec128 st2_1;
  Lib_IntVector_Intrinsics_vec128 st1_1;
  Lib_IntVector_Intrinsics_vec128 st0_1;
  Lib_IntVector_Intrinsics_vec128 k_1 [16];
  uint8_t plain [256];
  uint8_t *uu____2;
  Lib_IntVector_Intrinsics_vec128 y_15;
  Lib_IntVector_Intrinsics_vec128 x_15;
  Lib_IntVector_Intrinsics_vec128 y_14;
  Lib_IntVector_Intrinsics_vec128 x_14;
  Lib_IntVector_Intrinsics_vec128 y_13;
  Lib_IntVector_Intrinsics_vec128 x_13;
  Lib_IntVector_Intrinsics_vec128 y_12;
  Lib_IntVector_Intrinsics_vec128 x_12;
  Lib_IntVector_Intrinsics_vec128 y_11;
  Lib_IntVector_Intrinsics_vec128 x_11;
  Lib_IntVector_Intrinsics_vec128 y_10;
  Lib_IntVector_Intrinsics_vec128 x_10;
  Lib_IntVector_Intrinsics_vec128 y_9;
  Lib_IntVector_Intrinsics_vec128 x_9;
  Lib_IntVector_Intrinsics_vec128 y_8;
  Lib_IntVector_Intrinsics_vec128 x_8;
  Lib_IntVector_Intrinsics_vec128 y_7;
  Lib_IntVector_Intrinsics_vec128 x_7;
  Lib_IntVector_Intrinsics_vec128 y_6;
  Lib_IntVector_Intrinsics_vec128 x_6;
  Lib_IntVector_Intrinsics_vec128 y_5;
  Lib_IntVector_Intrinsics_vec128 x_5;
  Lib_IntVector_Intrinsics_vec128 y_4;
  Lib_IntVector_Intrinsics_vec128 x_4;
  Lib_IntVector_Intrinsics_vec128 y_3;
  Lib_IntVector_Intrinsics_vec128 x_3;
  Lib_IntVector_Intrinsics_vec128 y_2;
  Lib_IntVector_Intrinsics_vec128 x_2;
  Lib_IntVector_Intrinsics_vec128 y_1;
  Lib_IntVector_Intrinsics_vec128 x_1;
  Lib_IntVector_Intrinsics_vec128 y;
  Lib_IntVector_Intrinsics_vec128 x;
  uint32_t i0;
  Lib_IntVector_Intrinsics_vec128 v15;
  Lib_IntVector_Intrinsics_vec128 v14;
  Lib_IntVector_Intrinsics_vec128 v13;
  Lib_IntVector_Intrinsics_vec128 v12;
  Lib_IntVector_Intrinsics_vec128 v3__6;
  Lib_IntVector_Intrinsics_vec128 v1__6;
  Lib_IntVector_Intrinsics_vec128 v2__6;
  Lib_IntVector_Intrinsics_vec128 v0__6;
  Lib_IntVector_Intrinsics_vec128 v3__5;
  Lib_IntVector_Intrinsics_vec128 v2__5;
  Lib_IntVector_Intrinsics_vec128 v1__5;
  Lib_IntVector_Intrinsics_vec128 v0__5;
  Lib_IntVector_Intrinsics_vec128 v3_2;
  Lib_IntVector_Intrinsics_vec128 v2_2;
  Lib_IntVector_Intrinsics_vec128 v1_2;
  Lib_IntVector_Intrinsics_vec128 v0_2;
  Lib_IntVector_Intrinsics_vec128 v11;
  Lib_IntVector_Intrinsics_vec128 v10;
  Lib_IntVector_Intrinsics_vec128 v9;
  Lib_IntVector_Intrinsics_vec128 v8;
  Lib_IntVector_Intrinsics_vec128 v3__4;
  Lib_IntVector_Intrinsics_vec128 v1__4;
  Lib_IntVector_Intrinsics_vec128 v2__4;
  Lib_IntVector_Intrinsics_vec128 v0__4;
  Lib_IntVector_Intrinsics_vec128 v3__3;
  Lib_IntVector_Intrinsics_vec128 v2__3;
  Lib_IntVector_Intrinsics_vec128 v1__3;
  Lib_IntVector_Intrinsics_vec128 v0__3;
  Lib_IntVector_Intrinsics_vec128 v3_1;
  Lib_IntVector_Intrinsics_vec128 v2_1;
  Lib_IntVector_Intrinsics_vec128 v1_1;
  Lib_IntVector_Intrinsics_vec128 v0_1;
  Lib_IntVector_Intrinsics_vec128 v7;
  Lib_IntVector_Intrinsics_vec128 v6;
  Lib_IntVector_Intrinsics_vec128 v5;
  Lib_IntVector_Intrinsics_vec128 v4;
  Lib_IntVector_Intrinsics_vec128 v3__2;
  Lib_IntVector_Intrinsics_vec128 v1__2;
  Lib_IntVector_Intrinsics_vec128 v2__2;
  Lib_IntVector_Intrinsics_vec128 v0__2;
  Lib_IntVector_Intrinsics_vec128 v3__1;
  Lib_IntVector_Intrinsics_vec128 v2__1;
  Lib_IntVector_Intrinsics_vec128 v1__1;
  Lib_IntVector_Intrinsics_vec128 v0__1;
  Lib_IntVector_Intrinsics_vec128 v3_0;
  Lib_IntVector_Intrinsics_vec128 v2_0;
  Lib_IntVector_Intrinsics_vec128 v1_0;
  Lib_IntVector_Intrinsics_vec128 v0_0;
  Lib_IntVector_Intrinsics_vec128 v3;
  Lib_IntVector_Intrinsics_vec128 v2;
  Lib_IntVector_Intrinsics_vec128 v1;
  Lib_IntVector_Intrinsics_vec128 v0;
  Lib_IntVector_Intrinsics_vec128 v3__0;
  Lib_IntVector_Intrinsics_vec128 v1__0;
  Lib_IntVector_Intrinsics_vec128 v2__0;
  Lib_IntVector_Intrinsics_vec128 v0__0;
  Lib_IntVector_Intrinsics_vec128 v3__;
  Lib_IntVector_Intrinsics_vec128 v2__;
  Lib_IntVector_Intrinsics_vec128 v1__;
  Lib_IntVector_Intrinsics_vec128 v0__;
  Lib_IntVector_Intrinsics_vec128 v3_;
  Lib_IntVector_Intrinsics_vec128 v2_;
  Lib_IntVector_Intrinsics_vec128 v1_;
  Lib_IntVector_Intrinsics_vec128 v0_;
  Lib_IntVector_Intrinsics_vec128 st15;
  Lib_IntVector_Intrinsics_vec128 st14;
  Lib_IntVector_Intrinsics_vec128 st13;
  Lib_IntVector_Intrinsics_vec128 st12;
  Lib_IntVector_Intrinsics_vec128 st11;
  Lib_IntVector_Intrinsics_vec128 st10;
  Lib_IntVector_Intrinsics_vec128 st9;
  Lib_IntVector_Intrinsics_vec128 st8;
  Lib_IntVector_Intrinsics_vec128 st7;
  Lib_IntVector_Intrinsics_vec128 st6;
  Lib_IntVector_Intrinsics_vec128 st5;
  Lib_IntVector_Intrinsics_vec128 st4;
  Lib_IntVector_Intrinsics_vec128 st3;
  Lib_IntVector_Intrinsics_vec128 st2;
  Lib_IntVector_Intrinsics_vec128 st1;
  Lib_IntVector_Intrinsics_vec128 st0;
  Lib_IntVector_Intrinsics_vec128 k [16];
  uint8_t *uu____1;
  uint8_t *uu____0;
  uint32_t i;
  uint32_t rem1;
  uint32_t nb;
  uint32_t rem;
  Lib_IntVector_Intrinsics_vec128 ctx [16];
  uint32_t ctr_local;
  uint8_t *n_local;
  uint8_t *key_local;
  uint8_t *cipher_local;
  uint8_t *out_local;
  uint32_t len_local;
  undefined4 local_10f8;
  undefined4 uStack_10e4;
  undefined4 local_10c8;
  undefined4 uStack_10c4;
  undefined4 local_10b8;
  undefined4 uStack_10a4;
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 local_1078;
  undefined4 uStack_1064;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 local_1038;
  undefined4 uStack_1024;
  undefined4 uStack_f00;
  undefined4 uStack_efc;
  undefined4 uStack_ef0;
  undefined4 uStack_edc;
  undefined4 uStack_ec0;
  undefined4 uStack_ebc;
  undefined4 uStack_eb0;
  undefined4 uStack_e9c;
  undefined4 uStack_e80;
  undefined4 uStack_e7c;
  undefined4 uStack_e70;
  undefined4 uStack_e5c;
  undefined4 uStack_e40;
  undefined4 uStack_e3c;
  undefined4 uStack_e30;
  undefined4 uStack_e1c;
  undefined4 uStack_b00;
  undefined4 uStack_af0;
  undefined4 uStack_ae0;
  undefined4 uStack_ad0;
  undefined4 uStack_ac0;
  undefined4 uStack_ab0;
  undefined4 uStack_aa0;
  undefined4 uStack_a90;
  undefined4 uStack_a80;
  undefined4 uStack_a70;
  undefined4 uStack_a60;
  undefined4 uStack_a50;
  undefined4 uStack_a40;
  undefined4 uStack_a30;
  undefined4 uStack_a20;
  undefined4 uStack_a10;
  uint uStack_a00;
  uint uStack_9f0;
  uint uStack_9e0;
  uint uStack_9d0;
  uint uStack_9c0;
  uint uStack_9b0;
  uint uStack_9a0;
  uint uStack_990;
  uint uStack_980;
  uint uStack_970;
  uint uStack_960;
  uint uStack_950;
  uint uStack_940;
  uint uStack_930;
  uint uStack_920;
  uint uStack_910;
  
  ctx[0xf][1]._4_4_ = ctr;
  memset(&nb,0,0x100);
  chacha20_init_128((Lib_IntVector_Intrinsics_vec128 *)&nb,key,n,ctx[0xf][1]._4_4_);
  ctr_00 = len >> 8;
  for (uu____0._0_4_ = 0; (uint32_t)uu____0 < ctr_00; uu____0._0_4_ = (uint32_t)uu____0 + 1) {
    puVar2 = (ulong *)(out + ((uint32_t)uu____0 << 8));
    puVar3 = (ulong *)(cipher + ((uint32_t)uu____0 << 8));
    st0[1] = 0;
    chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)(st0 + 1),
                      (Lib_IntVector_Intrinsics_vec128 *)&nb,(uint32_t)uu____0);
    st0[0] = 0;
    v1__[1] = (longlong)uStack_920;
    v3__[1] = (longlong)uStack_940;
    v1__1[1] = (longlong)uStack_960;
    v3__1[1] = (longlong)uStack_980;
    v1__3[1] = (longlong)uStack_9a0;
    v3__3[1] = (longlong)uStack_9c0;
    v1__5[1] = (longlong)uStack_9e0;
    v3__5[1] = (longlong)uStack_a00;
    st0[1] = v1__[1];
    uVar1 = puVar3[1];
    *puVar2 = *puVar3 ^ v1__[1];
    puVar2[1] = uVar1;
    uVar1 = puVar3[3];
    puVar2[2] = puVar3[2] ^ v1__1[1];
    puVar2[3] = uVar1;
    uVar1 = puVar3[5];
    puVar2[4] = puVar3[4] ^ v1__3[1];
    puVar2[5] = uVar1;
    uVar1 = puVar3[7];
    puVar2[6] = puVar3[6] ^ v1__5[1];
    puVar2[7] = uVar1;
    uVar1 = puVar3[9];
    puVar2[8] = puVar3[8] ^ v2__[1];
    puVar2[9] = uVar1 ^ uStack_910;
    uVar1 = puVar3[0xb];
    puVar2[10] = puVar3[10] ^ v2__1[1];
    puVar2[0xb] = uVar1 ^ uStack_950;
    uVar1 = puVar3[0xd];
    puVar2[0xc] = puVar3[0xc] ^ v2__3[1];
    puVar2[0xd] = uVar1 ^ uStack_990;
    uVar1 = puVar3[0xf];
    puVar2[0xe] = puVar3[0xe] ^ v2__5[1];
    puVar2[0xf] = uVar1 ^ uStack_9d0;
    uVar1 = puVar3[0x11];
    puVar2[0x10] = puVar3[0x10] ^ v3__[1];
    puVar2[0x11] = uVar1;
    uVar1 = puVar3[0x13];
    puVar2[0x12] = puVar3[0x12] ^ v3__1[1];
    puVar2[0x13] = uVar1;
    uVar1 = puVar3[0x15];
    puVar2[0x14] = puVar3[0x14] ^ v3__3[1];
    puVar2[0x15] = uVar1;
    uVar1 = puVar3[0x17];
    puVar2[0x16] = puVar3[0x16] ^ v3__5[1];
    puVar2[0x17] = uVar1;
    uVar1 = puVar3[0x19];
    puVar2[0x18] = puVar3[0x18] ^ v0__0[1];
    puVar2[0x19] = uVar1 ^ uStack_930;
    uVar1 = puVar3[0x1b];
    puVar2[0x1a] = puVar3[0x1a] ^ v0__2[1];
    puVar2[0x1b] = uVar1 ^ uStack_970;
    uVar1 = puVar3[0x1d];
    puVar2[0x1c] = puVar3[0x1c] ^ v0__4[1];
    puVar2[0x1d] = uVar1 ^ uStack_9b0;
    uVar1 = puVar3[0x1f];
    puVar2[0x1e] = puVar3[0x1e] ^ v0__6[1];
    puVar2[0x1f] = uVar1 ^ uStack_9f0;
  }
  if ((len & 0xff) != 0) {
    k_1[0xf][1] = 0;
    memcpy(k_1[0xf] + 1,cipher + (ctr_00 << 8),(ulong)(len & 0xff));
    k_1[0xe][1] = 0;
    k_1[0xf][0] = 0;
    k_1[0xd][1] = 0;
    k_1[0xe][0] = 0;
    k_1[0xc][1] = 0;
    k_1[0xd][0] = 0;
    k_1[0xb][1] = 0;
    k_1[0xc][0] = 0;
    k_1[10][1] = 0;
    k_1[0xb][0] = 0;
    k_1[9][1] = 0;
    k_1[10][0] = 0;
    k_1[8][1] = 0;
    k_1[9][0] = 0;
    k_1[7][1] = 0;
    k_1[8][0] = 0;
    k_1[6][1] = 0;
    k_1[7][0] = 0;
    k_1[5][1] = 0;
    k_1[6][0] = 0;
    k_1[4][1] = 0;
    k_1[5][0] = 0;
    k_1[3][1] = 0;
    k_1[4][0] = 0;
    k_1[2][1] = 0;
    k_1[3][0] = 0;
    k_1[1][1] = 0;
    k_1[2][0] = 0;
    k_1[0][1] = 0;
    k_1[1][0] = 0;
    st0_1[1] = 0;
    k_1[0][0] = 0;
    chacha20_core_128((Lib_IntVector_Intrinsics_vec128 *)(st0_1 + 1),
                      (Lib_IntVector_Intrinsics_vec128 *)&nb,ctr_00);
    st0_1[0] = k_1[0][0];
    uStack_1024 = (undefined4)((ulong)k_1[0][1] >> 0x20);
    uStack_e1c = (undefined4)((ulong)k_1[1][0] >> 0x20);
    local_1038 = (undefined4)k_1[1][1];
    local_1048 = (undefined4)k_1[2][1];
    uStack_1044 = (undefined4)((ulong)k_1[2][1] >> 0x20);
    uStack_e30 = (undefined4)k_1[2][0];
    uStack_e40 = (undefined4)k_1[3][0];
    uStack_e3c = (undefined4)((ulong)k_1[3][0] >> 0x20);
    v0__7[1]._0_4_ = (undefined4)k_1[0xe][1];
    v1___1[1] = CONCAT44(uStack_1044,uStack_a20);
    v3___1[1] = CONCAT44(uStack_e3c,uStack_a40);
    uStack_1064 = (undefined4)((ulong)k_1[4][1] >> 0x20);
    uStack_e5c = (undefined4)((ulong)k_1[5][0] >> 0x20);
    local_1078 = (undefined4)k_1[5][1];
    local_1088 = (undefined4)k_1[6][1];
    uStack_1084 = (undefined4)((ulong)k_1[6][1] >> 0x20);
    uStack_e70 = (undefined4)k_1[6][0];
    uStack_e80 = (undefined4)k_1[7][0];
    uStack_e7c = (undefined4)((ulong)k_1[7][0] >> 0x20);
    v1__1_1[1] = CONCAT44(uStack_1084,uStack_a60);
    v3__1_1[1] = CONCAT44(uStack_e7c,uStack_a80);
    uStack_10a4 = (undefined4)((ulong)k_1[8][1] >> 0x20);
    uStack_e9c = (undefined4)((ulong)k_1[9][0] >> 0x20);
    local_10b8 = (undefined4)k_1[9][1];
    local_10c8 = (undefined4)k_1[10][1];
    uStack_10c4 = (undefined4)((ulong)k_1[10][1] >> 0x20);
    uStack_eb0 = (undefined4)k_1[10][0];
    uStack_ec0 = (undefined4)k_1[0xb][0];
    uStack_ebc = (undefined4)((ulong)k_1[0xb][0] >> 0x20);
    v1__3_1[1] = CONCAT44(uStack_10c4,uStack_aa0);
    v3__3_1[1] = CONCAT44(uStack_ebc,uStack_ac0);
    uStack_10e4 = (undefined4)((ulong)k_1[0xc][1] >> 0x20);
    uStack_edc = (undefined4)((ulong)k_1[0xd][0] >> 0x20);
    local_10f8 = (undefined4)k_1[0xd][1];
    len_local = (uint32_t)((ulong)k_1[0xe][1] >> 0x20);
    uStack_ef0 = (undefined4)k_1[0xe][0];
    uStack_f00 = (undefined4)k_1[0xf][0];
    uStack_efc = (undefined4)((ulong)k_1[0xf][0] >> 0x20);
    v1__5_1[1] = CONCAT44(len_local,uStack_ae0);
    v3__5_1[1] = CONCAT44(uStack_efc,uStack_b00);
    st0_1[1] = v1___1[1];
    k_1[0][0] = CONCAT44(local_1048,local_1038);
    k_1[0][1] = v1__1_1[1];
    k_1[1][0] = CONCAT44(local_1088,local_1078);
    k_1[1][1] = v1__3_1[1];
    k_1[2][0] = CONCAT44(local_10c8,local_10b8);
    k_1[2][1] = v1__5_1[1];
    k_1[3][0] = CONCAT44((undefined4)v0__7[1],local_10f8);
    k_1[4][0] = CONCAT44(uStack_1024,uStack_a10);
    k_1[5][0] = CONCAT44(uStack_1064,uStack_a50);
    k_1[6][0] = CONCAT44(uStack_10a4,uStack_a90);
    k_1[7][0] = CONCAT44(uStack_10e4,uStack_ad0);
    k_1[7][1] = v3___1[1];
    k_1[8][0] = CONCAT44(uStack_e40,uStack_e30);
    k_1[8][1] = v3__1_1[1];
    k_1[9][0] = CONCAT44(uStack_e80,uStack_e70);
    k_1[9][1] = v3__3_1[1];
    k_1[10][0] = CONCAT44(uStack_ec0,uStack_eb0);
    k_1[10][1] = v3__5_1[1];
    k_1[0xb][0] = CONCAT44(uStack_f00,uStack_ef0);
    k_1[0xc][0] = CONCAT44(uStack_e1c,uStack_a30);
    k_1[0xd][0] = CONCAT44(uStack_e5c,uStack_a70);
    k_1[0xe][0] = CONCAT44(uStack_e9c,uStack_ab0);
    k_1[0xf][0] = CONCAT44(uStack_edc,uStack_af0);
    k_1[0xf][1] = k_1[0xf][1] ^ v1___1[1];
    memcpy(out + (ctr_00 << 8),k_1[0xf] + 1,(ulong)(len & 0xff));
  }
  return;
}

Assistant:

void
Hacl_Chacha20_Vec128_chacha20_decrypt_128(
  uint32_t len,
  uint8_t *out,
  uint8_t *cipher,
  uint8_t *key,
  uint8_t *n,
  uint32_t ctr
)
{
  KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 ctx[16U] KRML_POST_ALIGN(16) = { 0U };
  chacha20_init_128(ctx, key, n, ctr);
  uint32_t rem = len % 256U;
  uint32_t nb = len / 256U;
  uint32_t rem1 = len % 256U;
  for (uint32_t i = 0U; i < nb; i++)
  {
    uint8_t *uu____0 = out + i * 256U;
    uint8_t *uu____1 = cipher + i * 256U;
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, i);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i0,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(uu____1 + i0 * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i0]);
      Lib_IntVector_Intrinsics_vec128_store32_le(uu____0 + i0 * 16U, y););
  }
  if (rem1 > 0U)
  {
    uint8_t *uu____2 = out + nb * 256U;
    uint8_t plain[256U] = { 0U };
    memcpy(plain, cipher + nb * 256U, rem * sizeof (uint8_t));
    KRML_PRE_ALIGN(16) Lib_IntVector_Intrinsics_vec128 k[16U] KRML_POST_ALIGN(16) = { 0U };
    chacha20_core_128(k, ctx, nb);
    Lib_IntVector_Intrinsics_vec128 st0 = k[0U];
    Lib_IntVector_Intrinsics_vec128 st1 = k[1U];
    Lib_IntVector_Intrinsics_vec128 st2 = k[2U];
    Lib_IntVector_Intrinsics_vec128 st3 = k[3U];
    Lib_IntVector_Intrinsics_vec128 st4 = k[4U];
    Lib_IntVector_Intrinsics_vec128 st5 = k[5U];
    Lib_IntVector_Intrinsics_vec128 st6 = k[6U];
    Lib_IntVector_Intrinsics_vec128 st7 = k[7U];
    Lib_IntVector_Intrinsics_vec128 st8 = k[8U];
    Lib_IntVector_Intrinsics_vec128 st9 = k[9U];
    Lib_IntVector_Intrinsics_vec128 st10 = k[10U];
    Lib_IntVector_Intrinsics_vec128 st11 = k[11U];
    Lib_IntVector_Intrinsics_vec128 st12 = k[12U];
    Lib_IntVector_Intrinsics_vec128 st13 = k[13U];
    Lib_IntVector_Intrinsics_vec128 st14 = k[14U];
    Lib_IntVector_Intrinsics_vec128 st15 = k[15U];
    Lib_IntVector_Intrinsics_vec128
    v0_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v1_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st0, st1);
    Lib_IntVector_Intrinsics_vec128
    v2_ = Lib_IntVector_Intrinsics_vec128_interleave_low32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v3_ = Lib_IntVector_Intrinsics_vec128_interleave_high32(st2, st3);
    Lib_IntVector_Intrinsics_vec128
    v0__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v1__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_, v2_);
    Lib_IntVector_Intrinsics_vec128
    v2__ = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128
    v3__ = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_, v3_);
    Lib_IntVector_Intrinsics_vec128 v0__0 = v0__;
    Lib_IntVector_Intrinsics_vec128 v2__0 = v2__;
    Lib_IntVector_Intrinsics_vec128 v1__0 = v1__;
    Lib_IntVector_Intrinsics_vec128 v3__0 = v3__;
    Lib_IntVector_Intrinsics_vec128 v0 = v0__0;
    Lib_IntVector_Intrinsics_vec128 v1 = v1__0;
    Lib_IntVector_Intrinsics_vec128 v2 = v2__0;
    Lib_IntVector_Intrinsics_vec128 v3 = v3__0;
    Lib_IntVector_Intrinsics_vec128
    v0_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v1_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st4, st5);
    Lib_IntVector_Intrinsics_vec128
    v2_0 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v3_0 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st6, st7);
    Lib_IntVector_Intrinsics_vec128
    v0__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v1__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_0, v2_0);
    Lib_IntVector_Intrinsics_vec128
    v2__1 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128
    v3__1 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_0, v3_0);
    Lib_IntVector_Intrinsics_vec128 v0__2 = v0__1;
    Lib_IntVector_Intrinsics_vec128 v2__2 = v2__1;
    Lib_IntVector_Intrinsics_vec128 v1__2 = v1__1;
    Lib_IntVector_Intrinsics_vec128 v3__2 = v3__1;
    Lib_IntVector_Intrinsics_vec128 v4 = v0__2;
    Lib_IntVector_Intrinsics_vec128 v5 = v1__2;
    Lib_IntVector_Intrinsics_vec128 v6 = v2__2;
    Lib_IntVector_Intrinsics_vec128 v7 = v3__2;
    Lib_IntVector_Intrinsics_vec128
    v0_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v1_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st8, st9);
    Lib_IntVector_Intrinsics_vec128
    v2_1 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v3_1 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st10, st11);
    Lib_IntVector_Intrinsics_vec128
    v0__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v1__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_1, v2_1);
    Lib_IntVector_Intrinsics_vec128
    v2__3 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128
    v3__3 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_1, v3_1);
    Lib_IntVector_Intrinsics_vec128 v0__4 = v0__3;
    Lib_IntVector_Intrinsics_vec128 v2__4 = v2__3;
    Lib_IntVector_Intrinsics_vec128 v1__4 = v1__3;
    Lib_IntVector_Intrinsics_vec128 v3__4 = v3__3;
    Lib_IntVector_Intrinsics_vec128 v8 = v0__4;
    Lib_IntVector_Intrinsics_vec128 v9 = v1__4;
    Lib_IntVector_Intrinsics_vec128 v10 = v2__4;
    Lib_IntVector_Intrinsics_vec128 v11 = v3__4;
    Lib_IntVector_Intrinsics_vec128
    v0_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v1_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st12, st13);
    Lib_IntVector_Intrinsics_vec128
    v2_2 = Lib_IntVector_Intrinsics_vec128_interleave_low32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v3_2 = Lib_IntVector_Intrinsics_vec128_interleave_high32(st14, st15);
    Lib_IntVector_Intrinsics_vec128
    v0__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v1__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v0_2, v2_2);
    Lib_IntVector_Intrinsics_vec128
    v2__5 = Lib_IntVector_Intrinsics_vec128_interleave_low64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128
    v3__5 = Lib_IntVector_Intrinsics_vec128_interleave_high64(v1_2, v3_2);
    Lib_IntVector_Intrinsics_vec128 v0__6 = v0__5;
    Lib_IntVector_Intrinsics_vec128 v2__6 = v2__5;
    Lib_IntVector_Intrinsics_vec128 v1__6 = v1__5;
    Lib_IntVector_Intrinsics_vec128 v3__6 = v3__5;
    Lib_IntVector_Intrinsics_vec128 v12 = v0__6;
    Lib_IntVector_Intrinsics_vec128 v13 = v1__6;
    Lib_IntVector_Intrinsics_vec128 v14 = v2__6;
    Lib_IntVector_Intrinsics_vec128 v15 = v3__6;
    k[0U] = v0;
    k[1U] = v4;
    k[2U] = v8;
    k[3U] = v12;
    k[4U] = v1;
    k[5U] = v5;
    k[6U] = v9;
    k[7U] = v13;
    k[8U] = v2;
    k[9U] = v6;
    k[10U] = v10;
    k[11U] = v14;
    k[12U] = v3;
    k[13U] = v7;
    k[14U] = v11;
    k[15U] = v15;
    KRML_MAYBE_FOR16(i,
      0U,
      16U,
      1U,
      Lib_IntVector_Intrinsics_vec128
      x = Lib_IntVector_Intrinsics_vec128_load32_le(plain + i * 16U);
      Lib_IntVector_Intrinsics_vec128 y = Lib_IntVector_Intrinsics_vec128_xor(x, k[i]);
      Lib_IntVector_Intrinsics_vec128_store32_le(plain + i * 16U, y););
    memcpy(uu____2, plain, rem * sizeof (uint8_t));
  }
}